

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.h
# Opt level: O0

void __thiscall cppcms::widgets::numeric<int>::numeric(numeric<int> *this)

{
  base_html_input *in_RDI;
  allocator local_29;
  string local_28 [40];
  
  cppcms::widgets::base_widget::base_widget((base_widget *)&in_RDI->field_0x60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"text",&local_29);
  cppcms::widgets::base_html_input::base_html_input
            (in_RDI,(string *)&PTR_construction_vtable_24__001207d0);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  in_RDI->_vptr_base_html_input = (_func_int **)0x1206e8;
  *(undefined8 *)&in_RDI->field_0x60 = 0x120778;
  in_RDI->field_0x3c = 0;
  in_RDI->field_0x3d = 0;
  in_RDI->field_0x3e = 0;
  std::__cxx11::string::string((string *)&in_RDI->field_0x40);
  return;
}

Assistant:

numeric() :
				base_html_input("text"),
				check_low_(false),
				check_high_(false),
				non_empty_(false)
			{
			}